

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QTimeZone::OffsetData>::reallocateAndGrow
          (QArrayDataPointer<QTimeZone::OffsetData> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QTimeZone::OffsetData> *old)

{
  long lVar1;
  bool bVar2;
  OffsetData *pOVar3;
  QGenericArrayOps<QTimeZone::OffsetData> *this_00;
  long in_RCX;
  long in_RDX;
  GrowthPosition in_ESI;
  QArrayDataPointer<QTimeZone::OffsetData> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QTimeZone::OffsetData> dp;
  undefined4 in_stack_ffffffffffffff68;
  AllocationOption in_stack_ffffffffffffff6c;
  OffsetData *in_stack_ffffffffffffff70;
  OffsetData *in_stack_ffffffffffffff78;
  QGenericArrayOps<QTimeZone::OffsetData> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QTimeZone::OffsetData> *n_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = in_RDI;
  if ((((in_ESI != GrowsAtEnd) || (in_RCX != 0)) ||
      (bVar2 = needsDetach((QArrayDataPointer<QTimeZone::OffsetData> *)in_stack_ffffffffffffff70),
      bVar2)) || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QTimeZone::OffsetData> *)&DAT_aaaaaaaaaaaaaaaa,(qsizetype)n_00,
                 in_ESI);
    if ((0 < in_RDX) &&
       (pOVar3 = data((QArrayDataPointer<QTimeZone::OffsetData> *)&stack0xffffffffffffffe0),
       pOVar3 == (OffsetData *)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        qBadAlloc();
      }
      goto LAB_00586329;
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach((QArrayDataPointer<QTimeZone::OffsetData> *)in_stack_ffffffffffffff70);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QGenericArrayOps<QTimeZone::OffsetData> *)
                  operator->((QArrayDataPointer<QTimeZone::OffsetData> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QTimeZone::OffsetData> *)0x586237);
        begin((QArrayDataPointer<QTimeZone::OffsetData> *)0x586246);
        QtPrivate::QGenericArrayOps<QTimeZone::OffsetData>::copyAppend
                  (this_00,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      }
      else {
        in_stack_ffffffffffffff70 =
             (OffsetData *)
             operator->((QArrayDataPointer<QTimeZone::OffsetData> *)&stack0xffffffffffffffe0);
        pOVar3 = begin((QArrayDataPointer<QTimeZone::OffsetData> *)0x58627c);
        begin((QArrayDataPointer<QTimeZone::OffsetData> *)0x58628b);
        QtPrivate::QGenericArrayOps<QTimeZone::OffsetData>::moveAppend
                  (in_stack_ffffffffffffff80,pOVar3,in_stack_ffffffffffffff70);
      }
    }
    swap((QArrayDataPointer<QTimeZone::OffsetData> *)in_stack_ffffffffffffff70,
         (QArrayDataPointer<QTimeZone::OffsetData> *)
         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (in_RCX != 0) {
      swap((QArrayDataPointer<QTimeZone::OffsetData> *)in_stack_ffffffffffffff70,
           (QArrayDataPointer<QTimeZone::OffsetData> *)
           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    ~QArrayDataPointer((QArrayDataPointer<QTimeZone::OffsetData> *)in_stack_ffffffffffffff70);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity((QArrayDataPointer<QTimeZone::OffsetData> *)in_stack_ffffffffffffff70);
    freeSpaceAtEnd((QArrayDataPointer<QTimeZone::OffsetData> *)in_stack_ffffffffffffff78);
    QtPrivate::QMovableArrayOps<QTimeZone::OffsetData>::reallocate
              ((QMovableArrayOps<QTimeZone::OffsetData> *)in_stack_ffffffffffffff78,
               (qsizetype)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00586329:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }